

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectwriter.cc
# Opt level: O3

bool __thiscall
google::protobuf::util::converter::ProtoStreamObjectWriter::IsStructListValue
          (ProtoStreamObjectWriter *this,Field *field)

{
  string *psVar1;
  converter *this_00;
  char *pcVar2;
  stringpiece_ssize_type in_RDX;
  stringpiece_ssize_type len;
  stringpiece_ssize_type extraout_RDX;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  StringPiece SVar6;
  
  psVar1 = (field->type_url_).ptr_;
  this_00 = (converter *)(psVar1->_M_dataplus)._M_p;
  pcVar2 = (char *)psVar1->_M_string_length;
  if ((long)pcVar2 < 0) {
    StringPiece::LogFatalSizeTooBig((size_t)pcVar2,"size_t to int conversion");
    in_RDX = extraout_RDX;
  }
  SVar6.length_ = in_RDX;
  SVar6.ptr_ = pcVar2;
  SVar6 = GetTypeWithoutUrl(this_00,SVar6);
  pcVar2 = SVar6.ptr_;
  if (SVar6.length_ == 0x19) {
    if (pcVar2 == "google.protobuf.ListValue") {
      bVar3 = true;
    }
    else {
      auVar5[0] = -(pcVar2[9] == 'o');
      auVar5[1] = -(pcVar2[10] == 't');
      auVar5[2] = -(pcVar2[0xb] == 'o');
      auVar5[3] = -(pcVar2[0xc] == 'b');
      auVar5[4] = -(pcVar2[0xd] == 'u');
      auVar5[5] = -(pcVar2[0xe] == 'f');
      auVar5[6] = -(pcVar2[0xf] == '.');
      auVar5[7] = -(pcVar2[0x10] == 'L');
      auVar5[8] = -(pcVar2[0x11] == 'i');
      auVar5[9] = -(pcVar2[0x12] == 's');
      auVar5[10] = -(pcVar2[0x13] == 't');
      auVar5[0xb] = -(pcVar2[0x14] == 'V');
      auVar5[0xc] = -(pcVar2[0x15] == 'a');
      auVar5[0xd] = -(pcVar2[0x16] == 'l');
      auVar5[0xe] = -(pcVar2[0x17] == 'u');
      auVar5[0xf] = -(pcVar2[0x18] == 'e');
      auVar4[0] = -(*pcVar2 == 'g');
      auVar4[1] = -(pcVar2[1] == 'o');
      auVar4[2] = -(pcVar2[2] == 'o');
      auVar4[3] = -(pcVar2[3] == 'g');
      auVar4[4] = -(pcVar2[4] == 'l');
      auVar4[5] = -(pcVar2[5] == 'e');
      auVar4[6] = -(pcVar2[6] == '.');
      auVar4[7] = -(pcVar2[7] == 'p');
      auVar4[8] = -(pcVar2[8] == 'r');
      auVar4[9] = -(pcVar2[9] == 'o');
      auVar4[10] = -(pcVar2[10] == 't');
      auVar4[0xb] = -(pcVar2[0xb] == 'o');
      auVar4[0xc] = -(pcVar2[0xc] == 'b');
      auVar4[0xd] = -(pcVar2[0xd] == 'u');
      auVar4[0xe] = -(pcVar2[0xe] == 'f');
      auVar4[0xf] = -(pcVar2[0xf] == '.');
      auVar4 = auVar4 & auVar5;
      bVar3 = (ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) == 0xffff;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ProtoStreamObjectWriter::IsStructListValue(
    const google::protobuf::Field& field) {
  return GetTypeWithoutUrl(field.type_url()) == kStructListValueType;
}